

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

int leveldb::anon_unknown_1::LockOrUnlock(int fd,bool lock)

{
  int iVar1;
  int *piVar2;
  undefined2 local_30;
  undefined2 local_2e;
  flock file_lock_info;
  bool lock_local;
  int fd_local;
  
  file_lock_info.l_pid._3_1_ = lock;
  file_lock_info._28_4_ = fd;
  piVar2 = __errno_location();
  *piVar2 = 0;
  memset(&local_30,0,0x20);
  local_30 = 2;
  if ((file_lock_info.l_pid._3_1_ & 1) != 0) {
    local_30 = 1;
  }
  local_2e = 0;
  file_lock_info.l_type = 0;
  file_lock_info.l_whence = 0;
  file_lock_info._4_4_ = 0;
  file_lock_info.l_start = 0;
  iVar1 = fcntl(file_lock_info._28_4_,6,&local_30);
  return iVar1;
}

Assistant:

int LockOrUnlock(int fd, bool lock) {
  errno = 0;
  struct ::flock file_lock_info;
  std::memset(&file_lock_info, 0, sizeof(file_lock_info));
  file_lock_info.l_type = (lock ? F_WRLCK : F_UNLCK);
  file_lock_info.l_whence = SEEK_SET;
  file_lock_info.l_start = 0;
  file_lock_info.l_len = 0;  // Lock/unlock entire file.
  return ::fcntl(fd, F_SETLK, &file_lock_info);
}